

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

void __thiscall
dlib::array<dlib::menu_bar::menu_data,_dlib::memory_manager_stateless_kernel_1<char>_>::set_max_size
          (array<dlib::menu_bar::menu_data,_dlib::memory_manager_stateless_kernel_1<char>_> *this,
          unsigned_long max)

{
  menu_data *pmVar1;
  memory_manager_stateless_kernel_1<dlib::menu_bar::menu_data> *in_RSI;
  long *in_RDI;
  unsigned_long in_stack_00000018;
  memory_manager_stateless_kernel_1<dlib::menu_bar::menu_data> *in_stack_00000020;
  menu_data *in_stack_ffffffffffffffe8;
  
  (**(code **)(*in_RDI + 0x18))();
  in_RDI[2] = 0;
  in_RDI[6] = 0;
  if (in_RSI == (memory_manager_stateless_kernel_1<dlib::menu_bar::menu_data> *)0x0) {
    if (in_RDI[4] != 0) {
      memory_manager_stateless_kernel_1<dlib::menu_bar::menu_data>::deallocate_array
                ((memory_manager_stateless_kernel_1<dlib::menu_bar::menu_data> *)0x0,
                 in_stack_ffffffffffffffe8);
    }
    in_RDI[3] = 0;
    in_RDI[4] = 0;
  }
  else if (in_RSI != (memory_manager_stateless_kernel_1<dlib::menu_bar::menu_data> *)in_RDI[3]) {
    if (in_RDI[4] != 0) {
      memory_manager_stateless_kernel_1<dlib::menu_bar::menu_data>::deallocate_array
                (in_RSI,in_stack_ffffffffffffffe8);
    }
    pmVar1 = memory_manager_stateless_kernel_1<dlib::menu_bar::menu_data>::allocate_array
                       (in_stack_00000020,in_stack_00000018);
    in_RDI[4] = (long)pmVar1;
    in_RDI[3] = (long)in_RSI;
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    set_max_size(
        unsigned long max
    )
    {
        reset();
        array_size = 0;
        last_pos = 0;
        if (max != 0)
        {
            // if new max size is different
            if (max != max_array_size)
            {
                if (array_elements)
                {
                    pool.deallocate_array(array_elements);
                }
                // try to get more memroy
                try { array_elements = pool.allocate_array(max); }
                catch (...) { array_elements = 0;  max_array_size = 0; throw; }
                max_array_size = max;
            }

        }
        // if the array is being made to be zero
        else
        {
            if (array_elements)
                pool.deallocate_array(array_elements);
            max_array_size = 0;
            array_elements = 0;
        }
    }